

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall ieee754::mantissa_msb_index(ieee754 *this)

{
  int iVar1;
  
  if (this->ebits < 8) {
    return this->bytes + -1;
  }
  iVar1 = 0;
  if ((uint)this->ebits < 0x10) {
    iVar1 = this->bytes + -2;
  }
  return iVar1;
}

Assistant:

int mantissa_msb_index() const
    {
        if (ebits <= 7)
            return bytes - 1;
        else if (ebits <= 15)
            return bytes - 2;
        else
        {
            assert(FALSE);
            return 0;
        }
    }